

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationweights.cpp
# Opt level: O3

UBool __thiscall
icu_63::CollationWeights::allocWeightsInShortRanges
          (CollationWeights *this,int32_t n,int32_t minLength)

{
  int iVar1;
  int iVar2;
  int32_t length;
  long lVar3;
  int iVar4;
  UErrorCode errorCode;
  UErrorCode local_c;
  
  if (0 < (long)this->rangeCount) {
    length = 1;
    lVar3 = 0;
    do {
      iVar1 = *(int *)((long)&this->ranges[0].length + lVar3);
      if (minLength + 1 < iVar1) {
        return '\0';
      }
      iVar2 = *(int *)((long)&this->ranges[0].count + lVar3);
      iVar4 = n - iVar2;
      if (iVar4 == 0 || n < iVar2) {
        if (minLength < iVar1) {
          *(int32_t *)((long)&this->ranges[0].count + lVar3) = n;
        }
        this->rangeCount = length;
        if (lVar3 != 0) {
          local_c = U_ZERO_ERROR;
          uprv_sortArray_63(this->ranges,length,0x10,compareRanges,(void *)0x0,'\0',&local_c);
          return '\x01';
        }
        return '\x01';
      }
      lVar3 = lVar3 + 0x10;
      length = length + 1;
      n = iVar4;
    } while ((long)this->rangeCount * 0x10 != lVar3);
  }
  return '\0';
}

Assistant:

UBool
CollationWeights::allocWeightsInShortRanges(int32_t n, int32_t minLength) {
    // See if the first few minLength and minLength+1 ranges have enough weights.
    for(int32_t i = 0; i < rangeCount && ranges[i].length <= (minLength + 1); ++i) {
        if(n <= ranges[i].count) {
            // Use the first few minLength and minLength+1 ranges.
            if(ranges[i].length > minLength) {
                // Reduce the number of weights from the last minLength+1 range
                // which might sort before some minLength ranges,
                // so that we use all weights in the minLength ranges.
                ranges[i].count = n;
            }
            rangeCount = i + 1;
#ifdef UCOL_DEBUG
            printf("take first %ld ranges\n", rangeCount);
#endif

            if(rangeCount>1) {
                /* sort the ranges by weight values */
                UErrorCode errorCode=U_ZERO_ERROR;
                uprv_sortArray(ranges, rangeCount, sizeof(WeightRange),
                               compareRanges, NULL, FALSE, &errorCode);
                /* ignore error code: we know that the internal sort function will not fail here */
            }
            return TRUE;
        }
        n -= ranges[i].count;  // still >0
    }
    return FALSE;
}